

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O2

char * iptos(u_long in)

{
  int iVar1;
  
  iVar1 = (int)iptos::which;
  iptos::which = (short)(iVar1 + 1);
  if (iVar1 + 1 == 0xc) {
    iptos::which = 0;
  }
  snprintf(iptos::output[iptos::which],0x10,"%d.%d.%d.%d",(ulong)((uint)in & 0xff),
           (ulong)((uint)(in >> 8) & 0xff),(ulong)((uint)(in >> 0x10) & 0xff),
           (uint)(in >> 0x18) & 0xff);
  return iptos::output[iptos::which];
}

Assistant:

char* iptos(u_long in)
{
    static char output[IPTOSBUFFERS][3 * 4 + 3 + 1];
    static short which;
    u_char* p;

    p = (u_char*)&in;
    which = (which + 1 == IPTOSBUFFERS ? 0 : which + 1);
    snprintf(output[which], sizeof(output[which]), "%d.%d.%d.%d", p[0], p[1], p[2], p[3]);
    return output[which];
}